

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regparse.c
# Opt level: O1

int onig_callout_tag_table_free(void *table)

{
  CalloutTagTable *t;
  
  if (table != (void *)0x0) {
    onig_st_foreach((st_table *)table,i_free_callout_tag_entry,0);
    onig_st_free_table((st_table *)table);
  }
  return 0;
}

Assistant:

extern int
onig_callout_tag_table_free(void* table)
{
  CalloutTagTable* t = (CalloutTagTable* )table;

  if (IS_NOT_NULL(t)) {
    int r = callout_tag_table_clear(t);
    if (r != 0) return r;

    onig_st_free_table(t);
  }

  return 0;
}